

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void duckdb_fmt::v6::internal::
     handle_cstring_type_spec<char,duckdb_fmt::v6::internal::arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,duckdb_fmt::v6::internal::error_handler>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  long *plVar1;
  size_t in_RCX;
  size_type *psVar2;
  void *in_RDX;
  int iVar3;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar3 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar3 != 0x73) {
    if (iVar3 == 0x70) {
      basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write_pointer<unsigned_long>
                (&handler->formatter->writer_,(unsigned_long)handler->value,
                 handler->formatter->specs_);
      return;
    }
    if (iVar3 != 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
      std::operator+(&local_38,"Invalid type specifier \"",&local_58);
      this = &local_38;
      plVar1 = (long *)std::__cxx11::string::append((char *)this);
      local_78._M_dataplus._M_p = (pointer)*plVar1;
      psVar2 = (size_type *)(plVar1 + 2);
      if ((size_type *)local_78._M_dataplus._M_p == psVar2) {
        local_78.field_2._M_allocated_capacity = *psVar2;
        local_78.field_2._8_8_ = plVar1[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar2;
      }
      local_78._M_string_length = plVar1[1];
      *plVar1 = (long)psVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      error_handler::on_error((error_handler *)this,&local_78);
    }
  }
  arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
  ::write(handler->formatter,(int)handler->value,in_RDX,in_RCX);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("Invalid type specifier \"" + std::string(1, spec) + "\" for formatting a value of type string");
}